

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O0

void __thiscall
NewClassExpression::NewClassExpression
          (NewClassExpression *this,ExpressionPtr *BaseClass,ExpressionPtr *Attributes)

{
  ExpressionPtr *Attributes_local;
  ExpressionPtr *BaseClass_local;
  NewClassExpression *this_local;
  
  TableBaseExpression::TableBaseExpression(&this->super_TableBaseExpression);
  (this->super_TableBaseExpression).super_Expression._vptr_Expression =
       (_func_int **)&PTR_GetType_00156048;
  std::__cxx11::string::string((string *)&this->m_Name);
  std::shared_ptr<Expression>::shared_ptr(&this->m_BaseClass);
  std::shared_ptr<Expression>::shared_ptr(&this->m_Attributes);
  std::vector<NewClassExpression::ClassElement,_std::allocator<NewClassExpression::ClassElement>_>::
  vector(&this->m_Elements);
  std::shared_ptr<Expression>::operator=(&this->m_BaseClass,BaseClass);
  std::shared_ptr<Expression>::operator=(&this->m_Attributes,Attributes);
  return;
}

Assistant:

explicit NewClassExpression( ExpressionPtr BaseClass, ExpressionPtr Attributes )
	{
		m_BaseClass = BaseClass;
		m_Attributes = Attributes;
	}